

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ManInvertConstraints(Gia_Man_t *pAig)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  int iVar8;
  
  if (pAig->nConstrs != 0) {
    iVar4 = pAig->nRegs;
    pVVar6 = pAig->vCos;
    iVar8 = pVVar6->nSize;
    iVar7 = iVar8 - iVar4;
    if (iVar7 != 0 && iVar4 <= iVar8) {
      lVar3 = 0;
      do {
        if (iVar8 <= lVar3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar8 = pVVar6->pArray[lVar3];
        if (((long)iVar8 < 0) || (pAig->nObjs <= iVar8)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pAig->pObjs == (Gia_Obj_t *)0x0) {
          return;
        }
        if ((long)iVar7 - (long)pAig->nConstrs <= lVar3) {
          pGVar1 = pAig->pObjs + iVar8;
          uVar2 = *(ulong *)pGVar1;
          uVar5 = (uint)uVar2;
          if ((-1 < (int)uVar5) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsCo(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x219,"void Gia_ObjFlipFaninC0(Gia_Obj_t *)");
          }
          *(ulong *)pGVar1 = uVar2 ^ 0x20000000;
          iVar4 = pAig->nRegs;
          pVVar6 = pAig->vCos;
        }
        lVar3 = lVar3 + 1;
        iVar8 = pVVar6->nSize;
        iVar7 = iVar8 - iVar4;
      } while (lVar3 < iVar7);
    }
  }
  return;
}

Assistant:

void Gia_ManInvertConstraints( Gia_Man_t * pAig )
{
    Gia_Obj_t * pObj;
    int i;
    if ( Gia_ManConstrNum(pAig) == 0 )
        return;
    Gia_ManForEachPo( pAig, pObj, i )
        if ( i >= Gia_ManPoNum(pAig) - Gia_ManConstrNum(pAig) )
            Gia_ObjFlipFaninC0( pObj );
}